

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy_test.cc
# Opt level: O0

void __thiscall
disruptor::test::BusySpinStrategy::SignalTimeoutWaitingOnCursor::test_method
          (SignalTimeoutWaitingOnCursor *this)

{
  undefined8 uVar1;
  bool bVar2;
  Sequence *in_RDI;
  thread waiter2;
  thread waiter;
  atomic<long> return_value;
  memory_order __b_1;
  memory_order __b;
  basic_cstring<const_char> *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  thread *in_stack_fffffffffffffe70;
  undefined8 local_148;
  basic_cstring<const_char> local_140;
  undefined1 local_130 [40];
  undefined1 local_108 [16];
  basic_cstring<const_char> local_f8;
  int64_t local_e8 [2];
  undefined8 *local_d8;
  undefined8 local_c8;
  basic_cstring<const_char> local_c0;
  undefined1 local_b0 [40];
  undefined1 local_88 [16];
  basic_cstring<const_char> local_78 [2];
  undefined8 *local_50;
  undefined8 local_40 [2];
  undefined8 local_30;
  memory_order local_28;
  undefined4 local_24;
  undefined8 *local_20;
  undefined8 local_18;
  memory_order local_10;
  undefined4 local_c;
  undefined8 *local_8;
  
  local_40[0] = 0xffffffffffffffff;
  local_50 = local_40;
  std::thread::
  thread<disruptor::test::BusySpinStrategy::SignalTimeoutWaitingOnCursor::test_method()::__0,,void>
            (in_stack_fffffffffffffe70,
             (type *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  std::thread::join();
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
               ,0x6b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffe40);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_78,0x54,local_88);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffe48,(char (*) [1])in_stack_fffffffffffffe40);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
               ,0x6b);
    local_8 = local_40;
    local_c = 5;
    local_10 = std::operator&(memory_order_seq_cst,__memory_order_mask);
    local_18 = local_40[0];
    local_c8 = local_40[0];
    in_stack_fffffffffffffe48 = "kTimeoutSignal";
    in_stack_fffffffffffffe40 = (basic_cstring<const_char> *)&kTimeoutSignal;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_b0,&local_c0,0x54,1,2,&local_c8,"return_value.load()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x116a83);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_d8 = local_40;
  std::thread::
  thread<disruptor::test::BusySpinStrategy::SignalTimeoutWaitingOnCursor::test_method()::__1,,void>
            (in_stack_fffffffffffffe70,
             (type *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  local_e8[0] = 1;
  Sequence::IncrementAndGet(in_RDI,local_e8);
  disruptor::BusySpinStrategy::SignalAllWhenBlocking((BusySpinStrategy *)(in_RDI[4].padding0_ + 3));
  std::thread::join();
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
               ,0x6b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffe40);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_f8,0x5e,local_108);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffe48,(char (*) [1])in_stack_fffffffffffffe40);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_140,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
               ,0x6b);
    local_20 = local_40;
    local_24 = 5;
    local_28 = std::operator&(memory_order_seq_cst,__memory_order_mask);
    local_30 = local_40[0];
    local_148 = local_40[0];
    in_stack_fffffffffffffe48 = "kFirstSequenceValue";
    in_stack_fffffffffffffe40 = (basic_cstring<const_char> *)&kFirstSequenceValue;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_130,&local_140,0x5e,1,2,&local_148,"return_value.load()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x116caf);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::thread::~thread((thread *)0x116cd5);
  std::thread::~thread((thread *)0x116ce2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(SignalTimeoutWaitingOnCursor) {
  std::atomic<int64_t> return_value(kInitialCursorValue);

  std::thread waiter([this, &return_value]() {
    return_value.store(strategy.WaitFor(kFirstSequenceValue, cursor, dependents,
                                        alerted,
                                        std::chrono::microseconds(1L)));
  });

  waiter.join();
  BOOST_CHECK_EQUAL(return_value.load(), kTimeoutSignal);

  std::thread waiter2([this, &return_value]() {
    return_value.store(strategy.WaitFor(kFirstSequenceValue, cursor, dependents,
                                        alerted, std::chrono::seconds(1L)));
  });

  cursor.IncrementAndGet(1L);
  strategy.SignalAllWhenBlocking();
  waiter2.join();
  BOOST_CHECK_EQUAL(return_value.load(), kFirstSequenceValue);
}